

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro.c
# Opt level: O3

void coro_stack_free(coro_stack *stack)

{
  void *pvVar1;
  long lVar2;
  size_t sVar3;
  
  pvVar1 = stack->sptr;
  if (pvVar1 != (void *)0x0) {
    if (coro_pagesize_pagesize == 0) {
      lVar2 = sysconf(0x1e);
      sVar3 = stack->ssze;
      coro_pagesize_pagesize = lVar2;
      if (lVar2 == 0) {
        coro_pagesize_pagesize = sysconf(0x1e);
        lVar2 = 0;
      }
    }
    else {
      sVar3 = stack->ssze;
      lVar2 = coro_pagesize_pagesize;
    }
    munmap((void *)((long)pvVar1 + lVar2 * -4),sVar3 + coro_pagesize_pagesize * 4);
    return;
  }
  return;
}

Assistant:

void
coro_stack_free (struct coro_stack *stack)
{
#if CORO_FIBER
  /* nop */
#else
  #if CORO_USE_VALGRIND
    VALGRIND_STACK_DEREGISTER (stack->valgrind_id);
  #endif

  #if CORO_MMAP
    if (stack->sptr)
      munmap ((void*)((char *)stack->sptr - CORO_GUARDPAGES * PAGESIZE),
              stack->ssze                 + CORO_GUARDPAGES * PAGESIZE);
  #else
    free (stack->sptr);
  #endif
#endif
}